

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InThread.cpp
# Opt level: O2

void __thiscall Thread::run(Thread *this)

{
  Element *pEVar1;
  int a;
  AutoTableElement tableElement;
  QArrayDataPointer<char16_t> local_118;
  Report report;
  TextElement titleElement;
  TextElement textElement;
  ImageElement imageElement;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  HelloWorldTableModel tableModel;
  QArrayDataPointer<char16_t> local_48;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  QString::QString((QString *)&imageElement,":/background.jpg");
  QImage::QImage((QImage *)&tableElement,(QString *)&imageElement,(char *)0x0);
  KDReports::Report::setWatermarkImage((QImage *)&report);
  QImage::~QImage((QImage *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&imageElement);
  _textElement = 1;
  _imageElement = (Data *)0x0;
  _tableElement = 0;
  _titleElement = (Data *)0x0;
  QFont::QFont((QFont *)&local_118,(QString *)&imageElement,0x30,-1,false);
  KDReports::Report::setWatermarkText
            ((QString *)&report,(AlignmentFlag)&tableElement,(QColor *)0x0,(QFont *)&textElement);
  QFont::~QFont((QFont *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&imageElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&titleElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QString::QString((QString *)&titleElement,":/logo.png");
  QImage::QImage((QImage *)&tableElement,(QString *)&titleElement,(char *)0x0);
  KDReports::ImageElement::ImageElement(&imageElement,(QImage *)&tableElement);
  QImage::~QImage((QImage *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&titleElement);
  pEVar1 = (Element *)KDReports::Report::header(&report,6);
  KDReports::Header::addElement(pEVar1,(AlignmentFlag)&imageElement);
  QObject::tr((QString *)&tableElement,"KD Reports Hello world example",(char *)0x0,-1);
  KDReports::TextElement::TextElement(&titleElement,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  KDReports::TextElement::setPointSize(18.0);
  _tableElement = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&titleElement,(QColor *)0x4);
  KDReports::Report::addVerticalSpacing(10.0);
  _tableElement = 0;
  KDReports::TextElement::TextElement(&textElement,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QObject::tr((QString *)&tableElement,"This is a sample report produced with KD Reports.",
              (char *)0x0,-1);
  KDReports::TextElement::operator<<(&textElement,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QString::QString((QString *)&tableElement,"\n");
  KDReports::TextElement::operator<<(&textElement,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QObject::tr((QString *)&tableElement,anon_var_dwarf_11e49,(char *)0x0,-1);
  KDReports::TextElement::operator<<(&textElement,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QString::QString((QString *)&tableElement,"\n");
  KDReports::TextElement::operator<<(&textElement,(QString *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  _tableElement = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&textElement,(QColor *)0x1);
  HelloWorldTableModel::HelloWorldTableModel(&tableModel);
  KDReports::Report::addVerticalSpacing(10.0);
  KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)&tableModel);
  KDReports::AbstractTableElement::setBorder(1.0);
  local_118.d._0_4_ = 0;
  local_118.d._4_2_ = 0xffff;
  local_118._6_8_ = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&tableElement,(QColor *)0x1);
  for (a = 1; a != 100; a = a + 1) {
    local_80.d._0_4_ = 0;
    local_80.d._4_2_ = 0;
    local_80.d._6_2_ = 0;
    local_80.ptr._0_6_ = 0x1064a6;
    local_80.ptr._6_2_ = 0;
    local_80.size = 0x1b;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QString::arg((QString *)&local_98,(QString *)&local_80,a,0,10,(QChar)0x20);
    KDReports::HtmlElement::HtmlElement((HtmlElement *)&local_118,(QString *)&local_98);
    KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&local_118,(QColor *)0x1);
    KDReports::HtmlElement::~HtmlElement((HtmlElement *)&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QString::QString((QString *)&local_98,"  - 2006");
    KDReports::TextElement::TextElement((TextElement *)&local_118,(QString *)&local_98);
    KDReports::Report::addInlineElement((Element *)&report);
    KDReports::TextElement::~TextElement((TextElement *)&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  KDReports::Report::addPageBreak();
  QString::QString((QString *)&local_98,"This is the last page");
  KDReports::TextElement::TextElement((TextElement *)&local_118,(QString *)&local_98);
  local_80.d._0_4_ = 0;
  local_80.d._4_2_ = 0xffff;
  local_80.d._6_2_ = 0;
  local_80.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&report,(AlignmentFlag)&local_118,(QColor *)0x1);
  KDReports::TextElement::~TextElement((TextElement *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QString::QString((QString *)&local_118,"output.png");
  KDReports::Report::exportToImage((QSize)&report,(QString *)0x4b0000000c8,(char *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QString::QString((QString *)&local_118,"output.pdf");
  KDReports::Report::exportToFile((QString *)&report,(QWidget *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  KDReports::AutoTableElement::~AutoTableElement(&tableElement);
  QAbstractTableModel::~QAbstractTableModel(&tableModel.super_QAbstractTableModel);
  KDReports::TextElement::~TextElement(&textElement);
  KDReports::TextElement::~TextElement(&titleElement);
  KDReports::ImageElement::~ImageElement(&imageElement);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void run() override
    {

        // Create a report
        KDReports::Report report;

        report.setWatermarkImage(QImage(":/background.jpg"));
        report.setWatermarkText(QString());

        KDReports::ImageElement imageElement(QImage(":/logo.png"));
        report.header().addElement(imageElement);

        // Add a text element for the title
        KDReports::TextElement titleElement(QObject::tr("KD Reports Hello world example"));
        titleElement.setPointSize(18);
        report.addElement(titleElement, Qt::AlignHCenter);

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add another text element, demonstrating "<<" operator
        KDReports::TextElement textElement;
        textElement << QObject::tr("This is a sample report produced with KD Reports.");
        textElement << "\n";
        textElement << QObject::tr("Klarälvdalens Datakonsult AB, Platform-independent software solutions");
        textElement << "\n";
        report.addElement(textElement);

        // Create a table model, which will be used by the table element
        HelloWorldTableModel tableModel;

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add an "auto table" (a table that shows the contents of a model)
        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setBorder(1);
        report.addElement(tableElement);

        // Add many paragraphs, to demonstrate page breaking
        for (int i = 1; i < 100; ++i) {
            report.addElement(KDReports::HtmlElement(QStringLiteral("<b>Customer</b> <em>%1</em>").arg(i)), Qt::AlignLeft);
            report.addInlineElement(KDReports::TextElement("  - 2006"));
        }

        // Add a page break
        report.addPageBreak();

        report.addElement(KDReports::TextElement("This is the last page"));

        // To export to an image file:
        // qDebug() << "Exporting to output.png";
        report.exportToImage(QSize(200, 1200), "output.png", "PNG"); // deleted by main() below

        // To export to a PDF file:
        // qDebug() << "Exporting to output.pdf";
        report.exportToFile("output.pdf"); // deleted by main() below
    }